

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::blackman_filter(float t)

{
  float in_XMM0_Da;
  double x;
  double dVar1;
  double in_stack_ffffffffffffffe8;
  undefined4 local_8;
  undefined4 local_4;
  
  local_8 = in_XMM0_Da;
  if (in_XMM0_Da < 0.0) {
    local_8 = -in_XMM0_Da;
  }
  if (3.0 <= local_8) {
    local_4 = 0.0;
  }
  else {
    x = sinc(in_stack_ffffffffffffffe8);
    dVar1 = blackman_exact_window(x);
    local_4 = clean(x * dVar1);
  }
  return local_4;
}

Assistant:

static float blackman_filter(float t) {
  if (t < 0.0f)
    t = -t;

  if (t < 3.0f)
    //return clean(sinc(t) * blackman_window(t / 3.0f));
    return clean(sinc(t) * blackman_exact_window(t / 3.0f));
  else
    return (0.0f);
}